

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_2ddrawer.cpp
# Opt level: O0

void __thiscall
F2DDrawer::AddPoly(F2DDrawer *this,FTexture *texture,FVector2 *points,int npoints,double originx,
                  double originy,double scalex,double scaley,DAngle *rotation,
                  FDynamicColormap *colormap,int lightlevel)

{
  float zz;
  int iVar1;
  FSimpleVertex *this_00;
  float fVar2;
  float uu;
  float vv;
  double dVar3;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_b8;
  float local_b4;
  float local_b0;
  float t;
  float v;
  float u;
  int i;
  float oy;
  float ox;
  float vscale;
  float uscale;
  float sinrot;
  float cosrot;
  uint32_t uStack_84;
  bool dorotate;
  DataSimplePoly poly;
  FMaterial *gltexture;
  FDynamicColormap *colormap_local;
  DAngle *rotation_local;
  double scaley_local;
  double scalex_local;
  double originy_local;
  double originx_local;
  int npoints_local;
  FVector2 *points_local;
  FTexture *texture_local;
  F2DDrawer *this_local;
  
  poly.super_DataGeneric._8_8_ = FMaterial::ValidateTexture(texture,false);
  if ((FMaterial *)poly.super_DataGeneric._8_8_ != (FMaterial *)0x0) {
    cosrot = 4.2039e-45;
    uStack_84 = 0x28;
    poly.mTexture._0_4_ = lightlevel;
    poly.super_DataGeneric.mLen = npoints;
    poly._24_8_ = colormap;
    poly.mColormap = (FDynamicColormap *)poly.super_DataGeneric._8_8_;
    poly.super_DataGeneric.mType =
         TArray<FSimpleVertex,_FSimpleVertex>::Reserve(&this->mVertices,npoints);
    sinrot._3_1_ = TAngle<double>::operator!=(rotation,0.0);
    dVar3 = TAngle<double>::Radians(rotation);
    dVar3 = cos(dVar3);
    uscale = (float)dVar3;
    dVar3 = TAngle<double>::Radians(rotation);
    dVar3 = sin(dVar3);
    vscale = (float)dVar3;
    iVar1 = FTexture::GetScaledWidth(texture);
    ox = (float)(1.0 / ((double)iVar1 * scalex));
    iVar1 = FTexture::GetScaledHeight(texture);
    oy = (float)(1.0 / ((double)iVar1 * scaley));
    if ((*(ushort *)&texture->field_0x31 >> 5 & 1) != 0) {
      oy = 0.0 - oy;
    }
    i = (int)(float)originx;
    u = (float)originy;
    for (v = 0.0; (int)v < npoints; v = (float)((int)v + 1)) {
      fVar2 = (points[(int)v].X - 0.5) - (float)i;
      local_b0 = (points[(int)v].Y - 0.5) - u;
      t = fVar2;
      if ((sinrot._3_1_ & 1) != 0) {
        t = fVar2 * uscale - local_b0 * vscale;
        local_b0 = local_b0 * uscale + fVar2 * vscale;
        local_b4 = fVar2;
      }
      this_00 = TArray<FSimpleVertex,_FSimpleVertex>::operator[]
                          (&this->mVertices,(long)(int)(poly.super_DataGeneric.mType + (int)v));
      fVar2 = points[(int)v].X;
      zz = points[(int)v].Y;
      uu = t * ox;
      vv = local_b0 * oy;
      PalEntry::PalEntry((PalEntry *)&local_b8.field_0,0xffffffff);
      FSimpleVertex::Set(this_00,fVar2,zz,0.0,uu,vv,(PalEntry)local_b8.field_0);
    }
    AddData(this,(DataGeneric *)&cosrot);
  }
  return;
}

Assistant:

void F2DDrawer::AddPoly(FTexture *texture, FVector2 *points, int npoints,
		double originx, double originy, double scalex, double scaley,
		DAngle rotation, FDynamicColormap *colormap, int lightlevel)
{
	FMaterial *gltexture = FMaterial::ValidateTexture(texture, false);

	if (gltexture == nullptr)
	{
		return;
	}
	DataSimplePoly poly;

	poly.mType = DrawTypePoly;
	poly.mLen = (sizeof(poly) + 7) & ~7;
	poly.mTexture = gltexture;
	poly.mColormap = colormap;
	poly.mLightLevel = lightlevel;
	poly.mVertCount = npoints;
	poly.mVertIndex = (int)mVertices.Reserve(npoints);

	bool dorotate = rotation != 0;

	float cosrot = cos(rotation.Radians());
	float sinrot = sin(rotation.Radians());

	float uscale = float(1.f / (texture->GetScaledWidth() * scalex));
	float vscale = float(1.f / (texture->GetScaledHeight() * scaley));
	if (texture->bHasCanvas)
	{
		vscale = 0 - vscale;
	}
	float ox = float(originx);
	float oy = float(originy);

	for (int i = 0; i < npoints; ++i)
	{
		float u = points[i].X - 0.5f - ox;
		float v = points[i].Y - 0.5f - oy;
		if (dorotate)
		{
			float t = u;
			u = t * cosrot - v * sinrot;
			v = v * cosrot + t * sinrot;
		}
		mVertices[poly.mVertIndex+i].Set(points[i].X, points[i].Y, 0, u*uscale, v*vscale);
	}
	AddData(&poly);
}